

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setFixedWidth(QWidget *this,int w)

{
  pointer pQVar1;
  QSize this_00;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  uint explMax;
  uint explMin;
  QWidgetPrivate *d;
  ushort uVar2;
  undefined4 in_stack_ffffffffffffffc0;
  ushort uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  QWidget *in_stack_ffffffffffffffe8;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x36bbce);
  QWidgetPrivate::createExtra(in_RDI);
  pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bbeb);
  uVar2 = (*(ushort *)&pQVar1->field_0x7c & 2) + 1;
  pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bc06);
  uVar3 = (*(ushort *)&pQVar1->field_0x7c >> 2 & 2) + 1;
  minimumSize((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QSize::height((QSize *)0x36bc37);
  setMinimumSize(in_stack_ffffffffffffffe8,(int)((ulong)lVar4 >> 0x20),(int)lVar4);
  this_00 = maximumSize((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QSize::height((QSize *)0x36bc68);
  setMaximumSize((QWidget *)this_00,(int)((ulong)lVar4 >> 0x20),(int)lVar4);
  pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bc8f);
  *(ushort *)&pQVar1->field_0x7c = (ushort)*(undefined4 *)&pQVar1->field_0x7c & 0xfffc | uVar2 & 3;
  pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bcb9);
  *(ushort *)&pQVar1->field_0x7c =
       ((ushort)*(undefined4 *)&pQVar1->field_0x7c & 0xfff3) + (uVar3 & 3) * 4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setFixedWidth(int w)
{
    Q_D(QWidget);
    d->createExtra();
    uint explMin = d->extra->explicitMinSize | Qt::Horizontal;
    uint explMax = d->extra->explicitMaxSize | Qt::Horizontal;
    setMinimumSize(w, minimumSize().height());
    setMaximumSize(w, maximumSize().height());
    d->extra->explicitMinSize = explMin;
    d->extra->explicitMaxSize = explMax;
}